

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

int imagetotif(opj_image_t *image,char *outfile)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  opj_image_comp_t *poVar3;
  convert_32s_PXCX p_Var4;
  opj_image_comp_t *poVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  OPJ_BYTE *pOVar9;
  OPJ_INT32 *__ptr;
  OPJ_SIZE_T OVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  OPJ_SIZE_T OVar14;
  undefined4 uVar15;
  OPJ_INT32 OVar16;
  char *__ptr_00;
  uint uVar17;
  long lVar18;
  size_t sStack_90;
  convert_32sXXx_C1R local_80;
  OPJ_INT32 *planes [4];
  
  poVar3 = image->comps;
  uVar17 = poVar3->prec;
  planes[0] = poVar3->data;
  uVar7 = image->numcomps;
  uVar6 = 4;
  if (image->color_space == OPJ_CLRSPC_CMYK) {
    if (3 < uVar7) {
      uVar15 = 5;
      goto LAB_0010d0da;
    }
    __ptr_00 = "imagetotif: CMYK images shall be composed of at least 4 planes.\n";
    sStack_90 = 0x40;
  }
  else {
    if (uVar7 < 3) {
      uVar15 = 1;
      uVar6 = uVar7;
    }
    else {
      if (uVar7 < 4) {
        uVar6 = uVar7;
      }
      uVar15 = 2;
    }
LAB_0010d0da:
    uVar13 = (ulong)uVar6;
    uVar12 = 1;
    poVar5 = poVar3;
    while( true ) {
      uVar11 = (uint)uVar12;
      uVar7 = uVar6 + (uVar6 == 0);
      if ((((uVar13 <= uVar12) || (uVar7 = uVar11, poVar3->dx != poVar5[1].dx)) ||
          (poVar3->dy != poVar5[1].dy)) ||
         ((uVar17 != poVar5[1].prec || (poVar3->sgnd != poVar5[1].sgnd)))) break;
      planes[uVar12] = poVar5[1].data;
      uVar12 = uVar12 + 1;
      poVar5 = poVar5 + 1;
    }
    if (uVar7 == uVar6) {
      if (((int)uVar17 < 0x11) && (uVar17 != 0)) {
        lVar8 = TIFFOpen(outfile,"wb");
        if (lVar8 == 0) {
          fprintf(_stderr,"imagetotif:failed to open %s for writing\n",outfile);
          return 1;
        }
        for (lVar18 = 0; uVar13 << 6 != lVar18; lVar18 = lVar18 + 0x40) {
          clip_component((opj_image_comp_t *)((long)&image->comps->dx + lVar18),image->comps->prec);
        }
        OVar16 = 0;
        switch(uVar17) {
        case 1:
        case 2:
        case 4:
        case 6:
        case 8:
          local_80 = convert_32sXXu_C1R_LUT[uVar17];
          break;
        case 3:
          local_80 = tif_32sto3u;
          break;
        case 5:
          local_80 = tif_32sto5u;
          break;
        case 7:
          local_80 = tif_32sto7u;
          break;
        case 9:
          local_80 = tif_32sto9u;
          break;
        case 10:
          local_80 = tif_32sto10u;
          break;
        case 0xb:
          local_80 = tif_32sto11u;
          break;
        case 0xc:
          local_80 = tif_32sto12u;
          break;
        case 0xd:
          local_80 = tif_32sto13u;
          break;
        case 0xe:
          local_80 = tif_32sto14u;
          break;
        case 0xf:
          local_80 = tif_32sto15u;
          break;
        case 0x10:
          local_80 = tif_32sto16u;
          break;
        default:
          local_80 = (convert_32sXXx_C1R)0x0;
        }
        poVar3 = image->comps;
        if (poVar3->sgnd != 0) {
          OVar16 = 1 << ((char)poVar3->prec - 1U & 0x1f);
        }
        p_Var4 = convert_32s_PXCX_LUT[uVar13];
        OVar1 = poVar3->w;
        OVar2 = poVar3->h;
        TIFFSetField(lVar8,0x100);
        TIFFSetField(lVar8,0x101,OVar2);
        TIFFSetField(lVar8,0x115,uVar13);
        TIFFSetField(lVar8,0x102,uVar17);
        TIFFSetField(lVar8,0x112,1);
        TIFFSetField(lVar8,0x11c,1);
        TIFFSetField(lVar8,0x106,uVar15);
        TIFFSetField(lVar8,0x116,1);
        uVar12 = TIFFStripSize(lVar8);
        OVar10 = (OPJ_SIZE_T)(int)OVar1;
        OVar14 = uVar13 * OVar10;
        if ((long)(int)uVar17 * OVar14 + 7 >> 3 == uVar12) {
          pOVar9 = (OPJ_BYTE *)_TIFFmalloc(uVar12);
          if (pOVar9 != (OPJ_BYTE *)0x0) {
            __ptr = (OPJ_INT32 *)malloc(OVar14 * 4);
            if (__ptr != (OPJ_INT32 *)0x0) {
              for (uVar17 = 0; uVar17 < image->comps->h; uVar17 = uVar17 + 1) {
                (*p_Var4)(planes,__ptr,OVar10,OVar16);
                (*local_80)(__ptr,pOVar9,OVar14);
                TIFFWriteEncodedStrip(lVar8,uVar17,pOVar9,uVar12);
                planes[0] = planes[0] + OVar10;
                planes[1] = planes[1] + OVar10;
                planes[2] = planes[2] + OVar10;
                planes[3] = planes[3] + OVar10;
              }
              _TIFFfree(pOVar9);
              TIFFClose(lVar8);
              free(__ptr);
              return 0;
            }
            _TIFFfree(pOVar9);
          }
        }
        else {
          fwrite("Invalid TIFF strip size\n",0x18,1,_stderr);
        }
        TIFFClose(lVar8);
        return 1;
      }
      fprintf(_stderr,"imagetotif: Bits=%d, Only 1 to 16 bits implemented\n",0);
      goto LAB_0010d4d3;
    }
    __ptr_00 = "imagetotif: All components shall have the same subsampling, same bit depth.\n";
    sStack_90 = 0x4c;
  }
  fwrite(__ptr_00,sStack_90,1,_stderr);
LAB_0010d4d3:
  fwrite("\tAborting\n",10,1,_stderr);
  return 1;
}

Assistant:

int imagetotif(opj_image_t * image, const char *outfile)
{
	int width, height;
	int bps,adjust, sgnd;
	int tiPhoto;
	TIFF *tif;
	tdata_t buf;
	tsize_t strip_size;
	OPJ_UINT32 i, numcomps;
	OPJ_SIZE_T rowStride;
	OPJ_INT32* buffer32s = NULL;
	OPJ_INT32 const* planes[4];
	convert_32s_PXCX cvtPxToCx = NULL;
	convert_32sXXx_C1R cvt32sToTif = NULL;

	bps = (int)image->comps[0].prec;
	planes[0] = image->comps[0].data;
	
	numcomps = image->numcomps;
	
	if (image->color_space == OPJ_CLRSPC_CMYK) {
		if (numcomps < 4U) {
			fprintf(stderr,"imagetotif: CMYK images shall be composed of at least 4 planes.\n");
			fprintf(stderr,"\tAborting\n");
			return 1;
		}
		tiPhoto = PHOTOMETRIC_SEPARATED;
		if (numcomps > 4U) {
			numcomps = 4U; /* Alpha not supported */
		}
	}
	else if (numcomps > 2U) {
		tiPhoto = PHOTOMETRIC_RGB;
		if (numcomps > 4U) {
			numcomps = 4U;
		}
	} else {
		tiPhoto = PHOTOMETRIC_MINISBLACK;
	}
	for (i = 1U; i < numcomps; ++i) {
		if (image->comps[0].dx != image->comps[i].dx) {
			break;
		}
		if (image->comps[0].dy != image->comps[i].dy) {
			break;
		}
		if (image->comps[0].prec != image->comps[i].prec) {
			break;
		}
		if (image->comps[0].sgnd != image->comps[i].sgnd) {
			break;
		}
		planes[i] = image->comps[i].data;
	}
	if (i != numcomps) {
		fprintf(stderr,"imagetotif: All components shall have the same subsampling, same bit depth.\n");
		fprintf(stderr,"\tAborting\n");
		return 1;
	}
	
	if(bps > 16) bps = 0;
	if(bps == 0)
	{
		fprintf(stderr,"imagetotif: Bits=%d, Only 1 to 16 bits implemented\n",bps);
		fprintf(stderr,"\tAborting\n");
		return 1;
	}
	tif = TIFFOpen(outfile, "wb");
	if (!tif)
	{
		fprintf(stderr, "imagetotif:failed to open %s for writing\n", outfile);
		return 1;
	}
	for (i = 0U; i < numcomps; ++i) {
		clip_component(&(image->comps[i]), image->comps[0].prec);
	}
	cvtPxToCx = convert_32s_PXCX_LUT[numcomps];
	switch (bps) {
		case 1:
		case 2:
		case 4:
		case 6:
		case 8:
			cvt32sToTif = convert_32sXXu_C1R_LUT[bps];
			break;
		case 3:
			cvt32sToTif = tif_32sto3u;
			break;
		case 5:
			cvt32sToTif = tif_32sto5u;
			break;
		case 7:
			cvt32sToTif = tif_32sto7u;
			break;
		case 9:
			cvt32sToTif = tif_32sto9u;
			break;
		case 10:
			cvt32sToTif = tif_32sto10u;
			break;
		case 11:
			cvt32sToTif = tif_32sto11u;
			break;
		case 12:
			cvt32sToTif = tif_32sto12u;
			break;
		case 13:
			cvt32sToTif = tif_32sto13u;
			break;
		case 14:
			cvt32sToTif = tif_32sto14u;
			break;
		case 15:
			cvt32sToTif = tif_32sto15u;
			break;
		case 16:
			cvt32sToTif = (convert_32sXXx_C1R)tif_32sto16u;
			break;
		default:
			/* never here */
			break;
	}
	sgnd = (int)image->comps[0].sgnd;
	adjust = sgnd ? 1 << (image->comps[0].prec - 1) : 0;
	width   = (int)image->comps[0].w;
	height  = (int)image->comps[0].h;
	
	TIFFSetField(tif, TIFFTAG_IMAGEWIDTH, width);
	TIFFSetField(tif, TIFFTAG_IMAGELENGTH, height);
	TIFFSetField(tif, TIFFTAG_SAMPLESPERPIXEL, numcomps);
	TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, bps);
	TIFFSetField(tif, TIFFTAG_ORIENTATION, ORIENTATION_TOPLEFT);
	TIFFSetField(tif, TIFFTAG_PLANARCONFIG, PLANARCONFIG_CONTIG);
	TIFFSetField(tif, TIFFTAG_PHOTOMETRIC, tiPhoto);
	TIFFSetField(tif, TIFFTAG_ROWSPERSTRIP, 1);
	
	strip_size = TIFFStripSize(tif);
	rowStride = ((OPJ_SIZE_T)width * numcomps * (OPJ_SIZE_T)bps + 7U) / 8U;
	if (rowStride != (OPJ_SIZE_T)strip_size) {
		fprintf(stderr, "Invalid TIFF strip size\n");
		TIFFClose(tif);
		return 1;
	}
	buf = _TIFFmalloc(strip_size);
	if (buf == NULL) {
		TIFFClose(tif);
		return 1;
	}
	buffer32s = (OPJ_INT32 *)malloc((OPJ_SIZE_T)width * numcomps * sizeof(OPJ_INT32));
	if (buffer32s == NULL) {
		_TIFFfree(buf);
		TIFFClose(tif);
		return 1;
	}
	
	for (i = 0; i < image->comps[0].h; ++i) {
		cvtPxToCx(planes, buffer32s, (OPJ_SIZE_T)width, adjust);
		cvt32sToTif(buffer32s, (OPJ_BYTE *)buf, (OPJ_SIZE_T)width * numcomps);
		(void)TIFFWriteEncodedStrip(tif, i, (void*)buf, strip_size);
		planes[0] += width;
		planes[1] += width;
		planes[2] += width;
		planes[3] += width;
	}
	_TIFFfree((void*)buf);
	TIFFClose(tif);
	free(buffer32s);
		
	return 0;
}